

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

hugeint_t __thiscall
duckdb::DeltaDecode<duckdb::hugeint_t>
          (duckdb *this,hugeint_t *data,hugeint_t previous_value,size_t size)

{
  hugeint_t *phVar1;
  ulong uVar2;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t iVar3;
  long lVar4;
  ulong uVar5;
  hugeint_t *phVar6;
  hugeint_t hVar7;
  hugeint_t a;
  hugeint_t local_58;
  hugeint_t local_40;
  
  uVar2 = previous_value.upper;
  local_40.upper = previous_value.lower;
  local_40.lower = (uint64_t)data;
  phVar1 = hugeint_t::operator+=((hugeint_t *)this,&local_40);
  uVar5 = 1;
  iVar3 = extraout_RDX;
  if (3 < uVar2) {
    local_58.lower = *(uint64_t *)this;
    local_58.upper = *(int64_t *)(this + 8);
    if ((uVar2 & 0xfffffffffffffffc) != 4) {
      phVar6 = (hugeint_t *)(this + 0x40);
      do {
        phVar1 = hugeint_t::operator+=(phVar6 + -3,&local_58);
        local_58.lower = phVar1->lower;
        local_58.upper = phVar1->upper;
        phVar1 = hugeint_t::operator+=(phVar6 + -2,&local_58);
        local_58.lower = phVar1->lower;
        local_58.upper = phVar1->upper;
        phVar1 = hugeint_t::operator+=(phVar6 + -1,&local_58);
        local_58.lower = phVar1->lower;
        local_58.upper = phVar1->upper;
        phVar1 = hugeint_t::operator+=(phVar6,&local_58);
        local_58.lower = phVar1->lower;
        local_58.upper = phVar1->upper;
        uVar5 = uVar5 + 4;
        phVar6 = phVar6 + 4;
        iVar3 = extraout_RDX_00;
      } while (uVar5 < (uVar2 & 0xfffffffffffffffc) - 4);
    }
  }
  lVar4 = uVar2 - uVar5;
  if (lVar4 != 0) {
    phVar6 = (hugeint_t *)(this + uVar5 * 0x10);
    do {
      phVar1 = hugeint_t::operator+=(phVar6,phVar6 + -1);
      phVar6 = phVar6 + 1;
      lVar4 = lVar4 + -1;
      iVar3 = extraout_RDX_01;
    } while (lVar4 != 0);
  }
  hVar7.upper = iVar3;
  hVar7.lower = (uint64_t)phVar1;
  return hVar7;
}

Assistant:

static T DeltaDecode(T *data, T previous_value, const size_t size) {
	D_ASSERT(size >= 1);

	data[0] += previous_value;

	const size_t UnrollQty = 4;
	const size_t sz0 = (size / UnrollQty) * UnrollQty; // equal to 0, if size < UnrollQty
	size_t i = 1;
	if (sz0 >= UnrollQty) {
		T a = data[0];
		for (; i < sz0 - UnrollQty; i += UnrollQty) {
			a = data[i] += a;
			a = data[i + 1] += a;
			a = data[i + 2] += a;
			a = data[i + 3] += a;
		}
	}
	for (; i != size; ++i) {
		data[i] += data[i - 1];
	}

	return data[size - 1];
}